

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.hpp
# Opt level: O2

void __thiscall
ableton::link::
Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
::handleTimelineFromClient
          (Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
           *this,Timeline *tl)

{
  long lVar1;
  rep rVar2;
  Timeline local_28;
  
  lVar1 = (tl->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
          super__Head_base<0UL,_long,_false>._M_head_impl;
  rVar2 = (tl->timeOrigin).__r;
  (this->mSessions).mCurrent.timeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tl->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  (this->mSessions).mCurrent.timeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl = lVar1;
  (this->mSessions).mCurrent.timeline.timeOrigin.__r = rVar2;
  Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
  ::setSessionTimeline(&this->mPeers,&this->mSessionId,tl);
  local_28.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (tuple<double>)
       (tl->tempo).super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_28.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       (tuple<long>)
       (tl->beatOrigin).super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_28.timeOrigin.__r = (tl->timeOrigin).__r;
  updateSessionTiming(this,&local_28,this->mGhostXForm);
  return;
}

Assistant:

void handleTimelineFromClient(Timeline tl)
  {
    mSessions.resetTimeline(tl);
    mPeers.setSessionTimeline(mSessionId, tl);
    updateSessionTiming(std::move(tl), mGhostXForm);
  }